

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O3

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::ReadFileBind<duckdb::ReadBlobOperation>
          (duckdb *this,ClientContext *context,TableFunctionBindInput *input,
          vector<duckdb::LogicalType,_true> *return_types,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *names)

{
  pointer pOVar1;
  _Head_base<0UL,_duckdb::ReadFileBindData_*,_false> _Var2;
  ClientContext *context_00;
  reference pvVar3;
  MultiFileList *pMVar4;
  pointer pRVar5;
  undefined1 local_88 [32];
  _Head_base<0UL,_duckdb::ReadFileBindData_*,_false> local_68;
  undefined1 local_60 [8];
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  
  local_68._M_head_impl = (ReadFileBindData *)operator_new(0x38);
  ((local_68._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)0x0;
  ((local_68._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = 0;
  ((local_68._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  ((local_68._M_head_impl)->super_TableFunctionData).column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((local_68._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__ReadFileBindData_0245ac10;
  ((local_68._M_head_impl)->files).
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = 0;
  ((local_68._M_head_impl)->files).
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_68._M_head_impl)->files).
  super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  MultiFileReader::Create((MultiFileReader *)local_60,input->table_function);
  context_00 = (ClientContext *)
               unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
               ::operator->((unique_ptr<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>,_true>
                             *)local_60);
  pvVar3 = vector<duckdb::Value,_true>::operator[](input->inputs,0);
  MultiFileReader::CreateFileList
            ((MultiFileReader *)local_58,context_00,(Value *)context,(FileGlobOptions)pvVar3);
  pMVar4 = shared_ptr<duckdb::MultiFileList,_true>::operator->
                     ((shared_ptr<duckdb::MultiFileList,_true> *)local_58);
  (*pMVar4->_vptr_MultiFileList[4])(local_48,pMVar4);
  pRVar5 = unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>,_true>
           ::operator->((unique_ptr<duckdb::ReadFileBindData,_std::default_delete<duckdb::ReadFileBindData>,_true>
                         *)&local_68);
  local_88._16_8_ =
       (pRVar5->files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
       super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (pRVar5->files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_48._16_8_;
  local_88._0_8_ =
       (pRVar5->files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
       super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88._8_8_ =
       (pRVar5->files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
       super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pRVar5->files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_48._0_8_;
  (pRVar5->files).super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
  super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_48._0_8_ = 0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)local_88);
  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)local_48);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  LogicalType::LogicalType((LogicalType *)local_88,VARCHAR);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)return_types,
             (LogicalType *)local_88);
  LogicalType::~LogicalType((LogicalType *)local_88);
  pOVar1 = (pointer)(local_88 + 0x10);
  local_88._0_8_ = pOVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"filename","");
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  if ((pointer)local_88._0_8_ != pOVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  LogicalType::LogicalType((LogicalType *)local_88,BLOB);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)return_types,
             (LogicalType *)local_88);
  LogicalType::~LogicalType((LogicalType *)local_88);
  local_88._0_8_ = pOVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"content","");
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  if ((pointer)local_88._0_8_ != pOVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  LogicalType::LogicalType((LogicalType *)local_88,BIGINT);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)return_types,
             (LogicalType *)local_88);
  LogicalType::~LogicalType((LogicalType *)local_88);
  local_88._0_8_ = pOVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"size","");
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  if ((pointer)local_88._0_8_ != pOVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  LogicalType::LogicalType((LogicalType *)local_88,TIMESTAMP_TZ);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)return_types,
             (LogicalType *)local_88);
  LogicalType::~LogicalType((LogicalType *)local_88);
  local_88._0_8_ = pOVar1;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"last_modified","");
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
  if ((pointer)local_88._0_8_ != pOVar1) {
    operator_delete((void *)local_88._0_8_);
  }
  _Var2._M_head_impl = local_68._M_head_impl;
  local_68._M_head_impl = (ReadFileBindData *)0x0;
  *(ReadFileBindData **)this = _Var2._M_head_impl;
  if ((__uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)
      local_60 !=
      (__uniq_ptr_impl<duckdb::MultiFileReader,_std::default_delete<duckdb::MultiFileReader>_>)0x0)
  {
    (**(code **)(*(_func_int **)local_60 + 8))();
    if (local_68._M_head_impl != (ReadFileBindData *)0x0) {
      (*((local_68._M_head_impl)->super_TableFunctionData).super_FunctionData._vptr_FunctionData[1])
                ();
    }
  }
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)this;
}

Assistant:

static unique_ptr<FunctionData> ReadFileBind(ClientContext &context, TableFunctionBindInput &input,
                                             vector<LogicalType> &return_types, vector<string> &names) {
	auto result = make_uniq<ReadFileBindData>();

	auto multi_file_reader = MultiFileReader::Create(input.table_function);
	result->files =
	    multi_file_reader->CreateFileList(context, input.inputs[0], FileGlobOptions::ALLOW_EMPTY)->GetAllFiles();

	return_types.push_back(LogicalType::VARCHAR);
	names.push_back("filename");
	return_types.push_back(OP::TYPE());
	names.push_back("content");
	return_types.push_back(LogicalType::BIGINT);
	names.push_back("size");
	return_types.push_back(LogicalType::TIMESTAMP_TZ);
	names.push_back("last_modified");

	return std::move(result);
}